

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.h
# Opt level: O0

void __thiscall xLearn::AUCMetric::AUCMetric(AUCMetric *this)

{
  Metric *in_RDI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *unaff_retaddr;
  uint in_stack_fffffffffffffff0;
  undefined4 uVar1;
  Metric *__new_size;
  
  __new_size = in_RDI;
  Metric::Metric(in_RDI);
  in_RDI->_vptr_Metric = (_func_int **)&PTR__AUCMetric_00266220;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1f3c87);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1f3c99);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1f3ca3);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1f3cad);
  uVar1 = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (unaff_retaddr,(size_type)__new_size,
             (value_type_conflict2 *)(ulong)in_stack_fffffffffffffff0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (unaff_retaddr,(size_type)__new_size,
             (value_type_conflict2 *)CONCAT44(uVar1,in_stack_fffffffffffffff0));
  return;
}

Assistant:

AUCMetric() {
    all_positive_number_.clear();
    all_negative_number_.clear();
    all_positive_number_.resize(kMaxBucketSize, 0);
    all_negative_number_.resize(kMaxBucketSize, 0);
  }